

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O2

_Bool al_make_path_canonical(ALLEGRO_PATH *path)

{
  ulong uVar1;
  char *pcVar2;
  ALLEGRO_USTR *us;
  size_t sVar3;
  uint i;
  
  i = 0;
  do {
    while( true ) {
      uVar1 = (path->segments)._size;
      if (uVar1 <= i) {
        if (uVar1 != 0) {
          us = get_segment(path,0);
          sVar3 = al_ustr_size(us);
          if (sVar3 == 0) {
            while ((((1 < (path->segments)._size &&
                     (pcVar2 = get_segment_cstr(path,1), *pcVar2 == '.')) && (pcVar2[1] == '.')) &&
                   (pcVar2[2] == '\0'))) {
              al_remove_path_component(path,1);
            }
          }
        }
        return true;
      }
      pcVar2 = get_segment_cstr(path,i);
      if ((*pcVar2 != '.') || (pcVar2[1] != '\0')) break;
      al_remove_path_component(path,i);
    }
    i = i + 1;
  } while( true );
}

Assistant:

bool al_make_path_canonical(ALLEGRO_PATH *path)
{
   unsigned i;
   ASSERT(path);

   for (i = 0; i < _al_vector_size(&path->segments); ) {
      if (strcmp(get_segment_cstr(path, i), ".") == 0)
         al_remove_path_component(path, i);
      else
         i++;
   }

   /* Remove leading '..'s on absolute paths. */
   if (_al_vector_size(&path->segments) >= 1 &&
      al_ustr_size(get_segment(path, 0)) == 0)
   {
      while (_al_vector_size(&path->segments) >= 2 &&
         strcmp(get_segment_cstr(path, 1), "..") == 0)
      {
         al_remove_path_component(path, 1);
      }
   }

   return true;
}